

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_constants_melee_critical(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  iVar2 = strcmp(__s1,"power-toh-scale-numerator");
  if (iVar2 == 0) {
    *(wchar_t *)((long)pvVar3 + 0xa0) = wVar1;
  }
  else {
    iVar2 = strcmp(__s1,"power-toh-scale-denominator");
    if (iVar2 == 0) {
      *(wchar_t *)((long)pvVar3 + 0xa4) = wVar1;
    }
    else {
      iVar2 = strcmp(__s1,"chance-power-scale-numerator");
      if (iVar2 == 0) {
        *(wchar_t *)((long)pvVar3 + 0xa8) = wVar1;
      }
      else {
        iVar2 = strcmp(__s1,"chance-power-scale-denominator");
        if (iVar2 == 0) {
          *(wchar_t *)((long)pvVar3 + 0xac) = wVar1;
        }
        else {
          iVar2 = strcmp(__s1,"chance-add-denominator");
          if (iVar2 == 0) {
            *(wchar_t *)((long)pvVar3 + 0xb0) = wVar1;
          }
          else {
            iVar2 = strcmp(__s1,"armsman-chance");
            if (iVar2 == 0) {
              if (wVar1 < L'\x01') {
                return PARSE_ERROR_INVALID_VALUE;
              }
              *(wchar_t *)((long)pvVar3 + 0xb4) = wVar1;
            }
            else {
              iVar2 = strcmp(__s1,"mana-burn-dice");
              if (iVar2 != 0) {
                return PARSE_ERROR_UNDEFINED_DIRECTIVE;
              }
              if (wVar1 < L'\0') {
                return PARSE_ERROR_INVALID_VALUE;
              }
              *(wchar_t *)((long)pvVar3 + 0xb8) = wVar1;
            }
          }
        }
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_constants_melee_critical(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	const char *label = parser_getsym(p, "label");
	int value = parser_getint(p, "value");

	if (streq(label, "power-toh-scale-numerator")) {
		z->m_crit_power_toh_scl_num = value;
	} else if (streq(label, "power-toh-scale-denominator")) {
		z->m_crit_power_toh_scl_den = value;
	} else if (streq(label, "chance-power-scale-numerator")) {
		z->m_crit_chance_power_scl_num = value;
	} else if (streq(label, "chance-power-scale-denominator")) {
		z->m_crit_chance_power_scl_den = value;
	} else if (streq(label, "chance-add-denominator")) {
		z->m_crit_chance_add_den = value;
	} else if (streq(label, "armsman-chance")) {
		if (value <= 0) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		z->m_armsman_chance = value;
	} else if (streq(label, "mana-burn-dice")) {
		if (value < 0) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		z->m_manaburn_dice = value;
	} else {
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	return PARSE_ERROR_NONE;
}